

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

uint64_t pow_mod_p(uint64_t a,uint64_t b)

{
  uint64_t a_00;
  undefined8 local_28;
  uint64_t t;
  uint64_t b_local;
  uint64_t a_local;
  
  a_local = a;
  if (b != 1) {
    a_00 = pow_mod_p(a,b >> 1);
    local_28 = mul_mod_p(a_00,a_00);
    if ((b & 1) != 0) {
      local_28 = mul_mod_p(local_28,a);
    }
    a_local = local_28;
  }
  return a_local;
}

Assistant:

static inline uint64_t
pow_mod_p(uint64_t a, uint64_t b) {
	if (b==1) {
		return a;
	}
	uint64_t t = pow_mod_p(a, b>>1);
	t = mul_mod_p(t,t);
	if (b % 2) {
		t = mul_mod_p(t, a);
	}
	return t;
}